

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

bool re2::TopEqual(Regexp *a,Regexp *b)

{
  CharClass *pCVar1;
  CharClass *pCVar2;
  bool bVar3;
  int iVar4;
  ostream *this;
  size_t __n;
  void *__s2;
  void *__s1;
  LogMessage LStack_188;
  
  if (a->op_ == b->op_) {
    bVar3 = true;
    switch(a->op_) {
    case '\x01':
    case '\x02':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
      goto switchD_001a4c59_caseD_1;
    case '\x03':
      if ((a->field_7).field_0.max_ == (b->field_7).field_0.max_) {
        return ((b->parse_flags_ ^ a->parse_flags_) & 1) == 0;
      }
      break;
    case '\x04':
      iVar4 = (a->field_7).field_0.max_;
      if ((iVar4 == (b->field_7).field_0.max_) && (((b->parse_flags_ ^ a->parse_flags_) & 1) == 0))
      {
        __s1 = (a->field_7).the_union_[1];
        __s2 = (b->field_7).the_union_[1];
        __n = (long)iVar4 << 2;
LAB_001a4d06:
        iVar4 = bcmp(__s1,__s2,__n);
        return iVar4 == 0;
      }
      break;
    case '\x05':
    case '\x06':
      return a->nsub_ == b->nsub_;
    case '\a':
    case '\b':
    case '\t':
      return ((b->parse_flags_ ^ a->parse_flags_) & 0x40) == 0;
    case '\n':
      if ((((b->parse_flags_ ^ a->parse_flags_) & 0x40) == 0) &&
         ((a->field_7).field_0.min_ == (b->field_7).field_0.min_)) goto switchD_001a4c59_caseD_15;
      break;
    case '\v':
      if ((a->field_7).field_0.max_ == (b->field_7).field_0.max_) {
        return (a->field_7).field_1.name_ == (b->field_7).field_1.name_;
      }
      break;
    case '\x13':
      return ((b->parse_flags_ ^ a->parse_flags_) >> 0xd & 1) == 0;
    case '\x14':
      pCVar1 = (a->field_7).field_3.cc_;
      pCVar2 = (b->field_7).field_3.cc_;
      if ((*(int *)(pCVar1 + 4) == *(int *)(pCVar2 + 4)) &&
         (*(int *)(pCVar1 + 0x10) == *(int *)(pCVar2 + 0x10))) {
        __n = (long)*(int *)(pCVar1 + 0x10) << 3;
        __s2 = *(void **)(pCVar2 + 8);
        __s1 = *(void **)(pCVar1 + 8);
        goto LAB_001a4d06;
      }
      break;
    case '\x15':
switchD_001a4c59_caseD_15:
      return (a->field_7).field_0.max_ == (b->field_7).field_0.max_;
    default:
      LogMessage::LogMessage
                (&LStack_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/regexp.cc"
                 ,0x19b);
      this = std::operator<<((ostream *)&LStack_188.str_,"Unexpected op in Regexp::Equal: ");
      std::ostream::operator<<(this,(uint)a->op_);
      LogMessage::~LogMessage(&LStack_188);
    }
  }
  bVar3 = false;
switchD_001a4c59_caseD_1:
  return bVar3;
}

Assistant:

Regexp* Regexp::LiteralString(Rune* runes, int nrunes, ParseFlags flags) {
  if (nrunes <= 0)
    return new Regexp(kRegexpEmptyMatch, flags);
  if (nrunes == 1)
    return NewLiteral(runes[0], flags);
  Regexp* re = new Regexp(kRegexpLiteralString, flags);
  for (int i = 0; i < nrunes; i++)
    re->AddRuneToString(runes[i]);
  return re;
}